

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O0

List<Js::ReturnedValue_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer> *
JsUtil::List<Js::ReturnedValue_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
New(Recycler *alloc,int increment)

{
  Recycler *alloc_00;
  List<Js::ReturnedValue_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer> *this;
  TrackAllocData local_40;
  int local_14;
  Recycler *pRStack_10;
  int increment_local;
  Recycler *alloc_local;
  
  local_14 = increment;
  pRStack_10 = alloc;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_40,
             (type_info *)
             &List<Js::ReturnedValue*,Memory::Recycler,false,Js::CopyRemovePolicy,DefaultComparer>::
              typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/List.h"
             ,0x12e);
  alloc_00 = Memory::Recycler::TrackAllocInfo(alloc,&local_40);
  this = (List<Js::ReturnedValue_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          *)new<Memory::Recycler>(0x30,alloc_00,0x446fd0);
  List(this,pRStack_10,local_14);
  return this;
}

Assistant:

static List * New(TAllocator * alloc, int increment = DefaultIncrement)
        {
            return AllocatorNew(TAllocator, alloc, List, alloc, increment);
        }